

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O3

int mbedtls_chacha20_self_test(int verbose)

{
  size_t data_len;
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uchar output [381];
  uchar auStack_1b8 [392];
  
  lVar4 = 0;
  bVar2 = true;
  while( true ) {
    if (verbose != 0) {
      printf("  ChaCha20 test %u ",lVar4);
    }
    data_len = test_lengths[lVar4];
    mbedtls_chacha20_crypt
              (test_keys[lVar4],test_nonces[lVar4],test_counters[lVar4],data_len,test_input[lVar4],
               auStack_1b8);
    iVar3 = bcmp(auStack_1b8,test_output + lVar4,data_len);
    if (iVar3 != 0) break;
    if (verbose == 0) {
      lVar4 = 1;
      bVar1 = !bVar2;
      bVar2 = false;
      if (bVar1) {
        return 0;
      }
    }
    else {
      puts("passed");
      lVar4 = 1;
      bVar1 = !bVar2;
      bVar2 = false;
      if (bVar1) {
        putchar(10);
        return 0;
      }
    }
  }
  if (verbose == 0) {
    return -1;
  }
  puts("failed (output)");
  return -1;
}

Assistant:

int mbedtls_chacha20_self_test( int verbose )
{
    unsigned char output[381];
    unsigned i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for( i = 0U; i < 2U; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ChaCha20 test %u ", i );

        ret = mbedtls_chacha20_crypt( test_keys[i],
                                      test_nonces[i],
                                      test_counters[i],
                                      test_lengths[i],
                                      test_input[i],
                                      output );

        ASSERT( 0 == ret, ( "error code: %i\n", ret ) );

        ASSERT( 0 == memcmp( output, test_output[i], test_lengths[i] ),
                ( "failed (output)\n" ) );

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}